

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path,char *name)

{
  xr_reader *local_88;
  bool local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  path_alias *local_30;
  path_alias *pa;
  char *name_local;
  char *path_local;
  xr_file_system *this_local;
  
  pa = (path_alias *)name;
  name_local = path;
  path_local = (char *)this;
  local_30 = find_path_alias(this,path);
  local_51 = local_30 == (path_alias *)0x0;
  if (local_51) {
    local_88 = (xr_reader *)0x0;
  }
  else {
    std::operator+(&local_50,&local_30->root,(char *)pa);
    local_88 = r_open(this,&local_50);
  }
  local_51 = !local_51;
  this_local = (xr_file_system *)local_88;
  if (local_51) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (xr_reader *)this_local;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? r_open(pa->root + name) : 0;
}